

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardmanager.h
# Opt level: O1

void __thiscall
Hoard::
HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
::unlocked_put(HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
               *this,SuperblockType *s,size_t sz)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  SuperblockType *pSVar4;
  SuperblockType *pSVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  
  if ((s != (SuperblockType *)0x0) &&
     (((s->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
       _magicNumber ^ (ulong)s) == 0xcafed00d)) {
    sVar7 = 0x10;
    if (0x10 < sz) {
      sVar7 = sz;
    }
    uVar1 = sVar7 * 2 - 1;
    uVar9 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0xffffffffffffffc0;
    (s->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
    _owner = (SmallHeap *)this;
    pSVar4 = this[3]._otherBins._item[uVar9 + 8].
             super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
             ._available._item[9];
    if (pSVar4 != s) {
      if (pSVar4 != (SuperblockType *)0x0) {
        uVar3 = (pSVar4->_header).
                super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
                _totalObjects;
        iVar6 = uVar3 - (pSVar4->_header).
                        super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>
                        ._objectsFree;
        if (iVar6 == 0) {
          lVar8 = 0;
        }
        else {
          lVar8 = (long)(int)((uint)(iVar6 * 8) / uVar3 + 1);
        }
        (pSVar4->_header).
        super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._prev =
             (BlockType *)0x0;
        (pSVar4->_header).
        super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._next =
             *(SuperblockType **)
              ((long)(&this[3]._otherBins._item[uVar9 + 7].
                       super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
                     + 1) + lVar8 * 8);
        pSVar5 = *(SuperblockType **)
                  ((long)(&this[3]._otherBins._item[uVar9 + 7].
                           super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
                         + 1) + lVar8 * 8);
        if (pSVar5 != (SuperblockType *)0x0) {
          (pSVar5->_header).
          super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._prev =
               pSVar4;
        }
        *(SuperblockType **)
         ((long)(&this[3]._otherBins._item[uVar9 + 7].
                  super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
                + 1) + lVar8 * 8) = pSVar4;
      }
      this[3]._otherBins._item[uVar9 + 8].
      super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
      ._available._item[9] = s;
    }
    uVar3 = (s->_header).
            super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
            _totalObjects;
    *(uint *)((this->_otherBins)._item[4].
              super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
              ._available._item + uVar9 + 1) =
         (*(int *)((this->_otherBins)._item[4].
                   super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
                   ._available._item + uVar9 + 1) + uVar3) -
         (s->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
         _objectsFree;
    piVar2 = (int *)((long)(this->_otherBins)._item[4].
                           super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
                           ._available._item + uVar9 * 8 + 0xc);
    *piVar2 = *piVar2 + uVar3;
  }
  return;
}

Assistant:

NO_INLINE void unlocked_put (SuperblockType * s, size_t sz) {
      if (!s || !s->isValidSuperblock()) {
	return;
      }

      Check<HoardManager, sanityCheck> check (this);

      const auto binIndex = binType::getSizeClass(sz);

      // Now put it on this heap.
      s->setOwner (reinterpret_cast<HeapType *>(this));
      _otherBins(binIndex).put (s);

      // Update the heap statistics with the allocated and in use stats
      // for the superblock.

      addStatsSuperblock (s, binIndex);
      assert (s->isValidSuperblock());

    }